

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamedDescribedEntity.cpp
# Opt level: O0

string * __thiscall NamedDescribedEntity::SoftPrint_abi_cxx11_(NamedDescribedEntity *this)

{
  ostream *poVar1;
  NamedDescribedEntity *this_00;
  string *in_RDI;
  stringstream ss;
  NamedDescribedEntity *in_stack_fffffffffffffde8;
  string local_1e8 [32];
  string local_1c8 [48];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"name:");
  GetName_abi_cxx11_(in_stack_fffffffffffffde8);
  poVar1 = std::operator<<(poVar1,local_1c8);
  this_00 = (NamedDescribedEntity *)std::operator<<(poVar1," - descr.");
  GetDescription_abi_cxx11_(this_00);
  std::operator<<((ostream *)this_00,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string NamedDescribedEntity::SoftPrint() const 
{ 
    stringstream ss;
    ss << "name:" << this->GetName() 
       << " - descr." << this->GetDescription(); 
    return(ss.str());
}